

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref cashew::ValueBuilder::makeCall(Ref target,Ref arg)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  Value *this;
  undefined8 *puVar4;
  void *__ptr;
  Value *local_40;
  Ref ret;
  
  ret = arg;
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = Value::setArray(pVVar2,3);
  __ptr = (void *)0x18;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  (RVar3.inst)->type = Null;
  Value::free(RVar3.inst,__ptr);
  (RVar3.inst)->type = String;
  pcVar1 = DIV;
  ((RVar3.inst)->field_1).str.str._M_len = CALL;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = Value::push_back(pVVar2,RVar3);
  pVVar2 = Value::push_back(pVVar2,target);
  this = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
  this->type = Null;
  RVar3.inst = Value::setArray(this,0);
  local_40 = Value::push_back(pVVar2,RVar3);
  puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&local_40);
  Value::push_back((Value *)*puVar4,ret);
  return (Ref)local_40;
}

Assistant:

static Ref makeCall(Ref target, Ref arg) {
    Ref ret = &makeRawArray(3)
                 ->push_back(makeRawString(CALL))
                 .push_back(target)
                 .push_back(makeRawArray());
    ret[2]->push_back(arg);
    return ret;
  }